

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequenceDistanceGraph.hpp
# Opt level: O3

void __thiscall
SequenceDistanceGraph::SequenceDistanceGraph
          (SequenceDistanceGraph *this,SequenceDistanceGraph *param_1)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pvVar3;
  undefined8 uVar4;
  pointer pNVar5;
  pointer pbVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  
  (this->super_DistanceGraph).sdg = (param_1->super_DistanceGraph).sdg;
  pvVar3 = (param_1->super_DistanceGraph).links.
           super__Vector_base<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->super_DistanceGraph).links.
  super__Vector_base<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->super_DistanceGraph).links.
       super__Vector_base<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->super_DistanceGraph).links.
  super__Vector_base<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pvVar3;
  (this->super_DistanceGraph).links.
  super__Vector_base<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->super_DistanceGraph).links.
       super__Vector_base<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->super_DistanceGraph).links.
  super__Vector_base<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->super_DistanceGraph).links.
  super__Vector_base<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (param_1->super_DistanceGraph).links.
  super__Vector_base<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paVar1 = &(this->super_DistanceGraph).name.field_2;
  (this->super_DistanceGraph).name._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (param_1->super_DistanceGraph).name._M_dataplus._M_p;
  paVar7 = &(param_1->super_DistanceGraph).name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar7) {
    uVar4 = *(undefined8 *)((long)&(param_1->super_DistanceGraph).name.field_2 + 8);
    paVar1->_M_allocated_capacity = paVar7->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->super_DistanceGraph).name.field_2 + 8) = uVar4;
  }
  else {
    (this->super_DistanceGraph).name._M_dataplus._M_p = pcVar2;
    (this->super_DistanceGraph).name.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
  }
  (this->super_DistanceGraph).name._M_string_length =
       (param_1->super_DistanceGraph).name._M_string_length;
  (param_1->super_DistanceGraph).name._M_dataplus._M_p = (pointer)paVar7;
  (param_1->super_DistanceGraph).name._M_string_length = 0;
  (param_1->super_DistanceGraph).name.field_2._M_local_buf[0] = '\0';
  pNVar5 = (param_1->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_start = (param_1->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
             super__Vector_impl_data._M_start;
  (this->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_finish = pNVar5;
  (this->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (param_1->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (param_1->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (param_1->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (param_1->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  paVar1 = &(this->filename).field_2;
  (this->filename)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (param_1->filename)._M_dataplus._M_p;
  paVar7 = &(param_1->filename).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar7) {
    uVar4 = *(undefined8 *)((long)&(param_1->filename).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar7->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->filename).field_2 + 8) = uVar4;
  }
  else {
    (this->filename)._M_dataplus._M_p = pcVar2;
    (this->filename).field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
  }
  (this->filename)._M_string_length = (param_1->filename)._M_string_length;
  (param_1->filename)._M_dataplus._M_p = (pointer)paVar7;
  (param_1->filename)._M_string_length = 0;
  (param_1->filename).field_2._M_local_buf[0] = '\0';
  paVar1 = &(this->fasta_filename).field_2;
  (this->fasta_filename)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (param_1->fasta_filename)._M_dataplus._M_p;
  paVar7 = &(param_1->fasta_filename).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar7) {
    uVar4 = *(undefined8 *)((long)&(param_1->fasta_filename).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar7->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->fasta_filename).field_2 + 8) = uVar4;
  }
  else {
    (this->fasta_filename)._M_dataplus._M_p = pcVar2;
    (this->fasta_filename).field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
  }
  (this->fasta_filename)._M_string_length = (param_1->fasta_filename)._M_string_length;
  (param_1->fasta_filename)._M_dataplus._M_p = (pointer)paVar7;
  (param_1->fasta_filename)._M_string_length = 0;
  (param_1->fasta_filename).field_2._M_local_buf[0] = '\0';
  pbVar6 = (param_1->oldnames).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->oldnames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->oldnames).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->oldnames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar6;
  (this->oldnames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->oldnames).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->oldnames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->oldnames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->oldnames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&(this->oldnames_to_ids)._M_h,&param_1->oldnames_to_ids);
  this->ws = param_1->ws;
  return;
}

Assistant:

explicit SequenceDistanceGraph(WorkSpace & _ws):nodes(0),DistanceGraph(*this,"SDG"),ws(_ws) { //sdg gets initialised through LDG
        add_node(Node("",NodeStatus::Deleted)); //an empty deleted node on 0, just to skip the space
    }